

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O0

LispPTR N_OP_boxidiff(LispPTR a,LispPTR tos)

{
  LispPTR *pLVar1;
  uint local_18;
  int arg2;
  LispPTR tos_local;
  LispPTR a_local;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (a >> 9)) ^ 2) & 0x7ff) == 2) {
    if ((tos & 0xfff0000) == 0xe0000) {
      local_18 = tos & 0xffff;
    }
    else if ((tos & 0xfff0000) == 0xf0000) {
      local_18 = tos | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00109204;
      pLVar1 = NativeAligned4FromLAddr(tos);
      local_18 = *pLVar1;
    }
    pLVar1 = NativeAligned4FromLAddr(a);
    *pLVar1 = *pLVar1 - local_18;
    tos_local = a;
  }
  else {
LAB_00109204:
    MachineState.errorexit = 1;
    tos_local = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return tos_local;
}

Assistant:

LispPTR N_OP_boxidiff(LispPTR a, LispPTR tos) {
  int arg2;

  if (GetTypeNumber(a) == TYPE_FIXP) {
    N_GETNUMBER(tos, arg2, bad);
    *((int *)NativeAligned4FromLAddr(a)) -= arg2;
    return (a);
  }
bad:
  ERROR_EXIT(tos);

}